

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)201>(Result *__return_storage_ptr__,Model *pipeline)

{
  PipelineRegressor *pPVar1;
  Pipeline *pipelineParams;
  
  if (pipeline->_oneof_case_[0] == 0xc9) {
    pPVar1 = (PipelineRegressor *)(pipeline->Type_).pipelineclassifier_;
  }
  else {
    pPVar1 = Specification::PipelineRegressor::default_instance();
  }
  pipelineParams = pPVar1->pipeline_;
  if (pipelineParams == (Pipeline *)0x0) {
    pipelineParams = (Pipeline *)&Specification::_Pipeline_default_instance_;
  }
  validate(__return_storage_ptr__,pipeline,pipelineParams);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_pipelineRegressor>(const Specification::Model& pipeline) {
        const auto& pipelineParams = pipeline.pipelineregressor().pipeline();
        // TODO -- validate regressor interface
        return validate(pipeline, pipelineParams);
    }